

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_MockPlugin_checkExpectationsAndClearAtEnd_TestShell::createTest
          (TEST_MockPlugin_checkExpectationsAndClearAtEnd_TestShell *this)

{
  TEST_MockPlugin_checkExpectationsAndClearAtEnd_Test *this_00;
  
  this_00 = (TEST_MockPlugin_checkExpectationsAndClearAtEnd_Test *)
            operator_new(0x80,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockPluginTest.cpp"
                         ,0x3a);
  TEST_MockPlugin_checkExpectationsAndClearAtEnd_Test::
  TEST_MockPlugin_checkExpectationsAndClearAtEnd_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockPlugin, checkExpectationsAndClearAtEnd)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foobar");
    MockExpectedCallsDidntHappenFailure expectedFailure(test, expectations);

    mock().expectOneCall("foobar");

    plugin.postTestAction(*test, *result);

    STRCMP_CONTAINS(expectedFailure.getMessage().asCharString(), output.getOutput().asCharString());
    LONGS_EQUAL(0, mock().expectedCallsLeft());
    CHECK_NO_MOCK_FAILURE();
}